

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::InvalidateCloneStrCandidate(BackwardPass *this,Opnd *opnd)

{
  _func_int **pp_Var1;
  Opnd *this_00;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_003e84ac;
    *puVar5 = 0;
  }
  if (this->tag == BackwardPhase) {
    pp_Var1 = opnd[1]._vptr_Opnd;
    if (this->currentInstr->m_opcode == Add_A) {
      this_00 = this->currentInstr->m_src1;
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_003e84ac:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      if (*(int *)(this_00[1]._vptr_Opnd + 2) == *(int *)(pp_Var1 + 2)) {
        return;
      }
    }
    if (((this->currentPrePassLoop == (Loop *)0x0) && (this->isCollectionPass == false)) &&
       (this->currentBlock->loop != (Loop *)0x0)) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->cloneStrCandidates,*(BVIndex *)(pp_Var1 + 2));
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::InvalidateCloneStrCandidate(IR::Opnd * opnd)
{
    IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
    Assert(regOpnd != nullptr);
    StackSym *sym = regOpnd->m_sym;

    if (tag == Js::BackwardPhase &&
        (currentInstr->m_opcode != Js::OpCode::Add_A || currentInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id != sym->m_id) &&
        !this->IsPrePass() &&
        !this->IsCollectionPass() &&
        this->currentBlock->loop)
    {
            currentBlock->cloneStrCandidates->Clear(sym->m_id);
    }
}